

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O0

Section * mocker::genBssSection(Section *__return_storage_ptr__,Module *irModule)

{
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  Module *local_18;
  Module *irModule_local;
  Section *res;
  
  local_19 = 0;
  local_18 = irModule;
  irModule_local = (Module *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,".bss",&local_41);
  nasm::Section::Section(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

nasm::Section genBssSection(const ir::Module &irModule) {
  nasm::Section res(".bss");
  return res;
}